

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O2

void RigidBodyDynamics::ForwardDynamicsLagrangian
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,VectorNd *QDDot,
               LinearSolver linear_solver,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext,MatrixNd *H,
               VectorNd *C)

{
  DenseStorage<double,__1,__1,__1,_0> *this;
  DenseStorage<double,__1,__1,_1,_0> *this_00;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_120;
  undefined1 local_110 [64];
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_d0;
  
  this = (DenseStorage<double,__1,__1,__1,_0> *)H;
  if (H == (MatrixNd *)0x0) {
    this = (DenseStorage<double,__1,__1,__1,_0> *)operator_new(0x18);
    local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = (double *)(ulong)model->dof_count;
    local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         = (Index)local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,_1,_1,0,_1,_1> *)this,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)(local_110 + 0x40));
  }
  this_00 = (DenseStorage<double,__1,__1,_1,_0> *)C;
  if (C == (VectorNd *)0x0) {
    this_00 = (DenseStorage<double,__1,__1,_1,_0> *)operator_new(0x10);
    local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
         = (double *)(ulong)model->dof_count;
    local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = 0;
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)this_00,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)(local_110 + 0x40));
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)QDDot);
  InverseDynamics(model,Q,QDot,QDDot,(VectorNd *)this_00,f_ext);
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)this,false);
  switch(linear_solver) {
  case LinearSolverPartialPivLU:
    Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_110 + 0x40),
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    local_110._16_8_ = this_00->m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)local_110;
    local_110._32_8_ = -1.0;
    local_120.m_dec =
         (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_110 + 0x40);
    local_110._8_8_ = this_00;
    local_110._48_8_ = Tau;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>>
              (QDDot,(Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_120);
    Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU
              ((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_110 + 0x40));
    break;
  case LinearSolverColPivHouseholderQR:
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_110 + 0x40),
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    local_110._16_8_ = this_00->m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)local_110;
    local_110._32_8_ = -1.0;
    local_120.m_dec =
         (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_110 + 0x40);
    local_110._8_8_ = this_00;
    local_110._48_8_ = Tau;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>>
              (QDDot,&local_120);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
              ((ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_110 + 0x40))
    ;
    break;
  case LinearSolverHouseholderQR:
    Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_110 + 0x40),
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    local_110._16_8_ = this_00->m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)local_110;
    local_110._32_8_ = -1.0;
    local_120.m_dec =
         (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_110 + 0x40);
    local_110._8_8_ = this_00;
    local_110._48_8_ = Tau;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>>
              (QDDot,(Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_120);
    Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
              ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(local_110 + 0x40));
    break;
  case LinearSolverLLT:
    Eigen::LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)local_110,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         = this_00->m_rows;
    local_120.m_rhs =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          *)(local_110 + 0x40);
    local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = -0x4010000000000000;
    local_120.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_110;
    local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         = (Index)this_00;
    local_d0.m_colsPermutation.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
    .m_storage.m_rows = (Index)Tau;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>>
              (QDDot,(Solve<Eigen::LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_120);
    free((void *)local_110._0_8_);
  }
  if (C == (VectorNd *)0x0) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage(this_00);
    operator_delete(this_00,0x10);
  }
  if (H == (MatrixNd *)0x0) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage(this);
    operator_delete(this,0x18);
  }
  return;
}

Assistant:

RBDL_DLLAPI void ForwardDynamicsLagrangian (
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    const VectorNd &Tau,
    VectorNd &QDDot,
    Math::LinearSolver linear_solver,
    std::vector<SpatialVector> *f_ext,
    Math::MatrixNd *H,
    Math::VectorNd *C) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  bool free_H = false;
  bool free_C = false;

  if (H == NULL) {
    H = new MatrixNd (MatrixNd::Zero(model.dof_count, model.dof_count));
    free_H = true;
  }

  if (C == NULL) {
    C = new VectorNd (VectorNd::Zero(model.dof_count));
    free_C = true;
  }

  // we set QDDot to zero to compute C properly with the InverseDynamics
  // method.
  QDDot.setZero();

  InverseDynamics (model, Q, QDot, QDDot, (*C), f_ext);
  CompositeRigidBodyAlgorithm (model, Q, *H, false);

  LOG << "A = " << std::endl << *H << std::endl;
  LOG << "b = " << std::endl << *C * -1. + Tau << std::endl;

#ifdef RBDL_USE_CASADI_MATH
    QDDot = H->inverse() * (*C * -1. + Tau);
#else
  switch (linear_solver) {
    case (LinearSolverPartialPivLU) :
      QDDot = H->partialPivLu().solve (*C * -1. + Tau);
      break;
    case (LinearSolverColPivHouseholderQR) :
      QDDot = H->colPivHouseholderQr().solve (*C * -1. + Tau);
      break;
    case (LinearSolverHouseholderQR) :
      QDDot = H->householderQr().solve (*C * -1. + Tau);
      break;
    case (LinearSolverLLT) :
      QDDot = H->llt().solve (*C * -1. + Tau);
      break;
    default:
      LOG << "Error: Invalid linear solver: " << linear_solver << std::endl;
      assert (0);
      break;
  }
#endif

  if (free_C) {
    delete C;
  }

  if (free_H) {
    delete H;
  }

  LOG << "x = " << QDDot << std::endl;
}